

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

int main(int argc,char **argv)

{
  ostream *this;
  HermiteSpline<3U,_2U> local_d8;
  _InputArray local_b8;
  allocator<char> local_99;
  string local_98 [39];
  allocator<char> local_71;
  string local_70 [55];
  allocator<char> local_39;
  string local_38 [32];
  char **local_18;
  char **argv_local;
  int argc_local;
  
  argv_local._4_4_ = 0;
  local_18 = argv;
  argv_local._0_4_ = argc;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_38,"w1",&local_39);
  cv::namedWindow(local_38,1);
  std::__cxx11::string::~string(local_38);
  std::allocator<char>::~allocator(&local_39);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_70,"w1",&local_71);
  cv::setMouseCallback(local_70,click_callback,(void *)0x0);
  std::__cxx11::string::~string(local_70);
  std::allocator<char>::~allocator(&local_71);
  this = std::operator<<((ostream *)&std::cout,
                         "Click on a spot with the left mouse button and hold down CTRL to add a point to the spline."
                        );
  std::ostream::operator<<(this,std::endl<char,std::char_traits<char>>);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_98,"w1",&local_99);
  cv::_InputArray::_InputArray<cv::Vec<float,3>>(&local_b8,&frame);
  cv::imshow(local_98,&local_b8);
  cv::_InputArray::~_InputArray(&local_b8);
  std::__cxx11::string::~string(local_98);
  std::allocator<char>::~allocator(&local_99);
  cv::waitKey(0);
  fit_and_draw_spline<HermiteSpline<3u,2u>>();
  HermiteSpline<3U,_2U>::~HermiteSpline(&local_d8);
  cv::waitKey(0);
  return 0;
}

Assistant:

int main(int argc, char **argv)
{
    namedWindow(WINDOW1, 1);
    setMouseCallback(WINDOW1, click_callback, NULL);

    cout << "Click on a spot with the left mouse button and hold down CTRL to add a point to the spline." << endl;

    imshow(WINDOW1, frame);
    waitKey(0);

    fit_and_draw_spline<CubicHermiteSpline<2>>();
    waitKey(0);

    return 0;
}